

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeGetLinWorkSpace(void *arkode_mem,long *lenrw,long *leniw)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  int retval;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  ARKodeMem in_stack_ffffffffffffffb8;
  long local_40;
  long local_38;
  long local_30;
  long *local_20;
  long *local_18;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x496,"ARKodeGetLinWorkSpace",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (*(int *)(in_RDI + 0x128) == 0) {
    *in_RDX = 0;
    *in_RSI = 0;
    local_4 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_4 = arkLs_AccessLMem(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                               (ARKLsMem *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (local_4 == 0) {
      *local_18 = 3;
      *local_20 = 0x1e;
      if (*(long *)(*(long *)(*(long *)(local_30 + 0x58) + 8) + 0x20) != 0) {
        N_VSpace(*(undefined8 *)(local_30 + 0x58),&local_38,&local_40);
        *local_18 = local_38 * 2 + *local_18;
        *local_20 = local_40 * 2 + *local_20;
      }
      if (((*(long *)(local_30 + 0x48) != 0) &&
          (*(long *)(*(long *)(*(long *)(local_30 + 0x48) + 8) + 0x50) != 0)) &&
         (iVar1 = SUNMatSpace(*(undefined8 *)(local_30 + 0x48),&stack0xffffffffffffffb8,
                              &stack0xffffffffffffffb0), iVar1 == 0)) {
        *local_18 = (long)&in_stack_ffffffffffffffb8->sunctx + *local_18;
        *local_20 = (long)(in_stack_ffffffffffffffb0 + *local_20);
      }
      if ((*(long *)(*(long *)(*(long *)(local_30 + 0x38) + 8) + 0x60) != 0) &&
         (iVar1 = SUNLinSolSpace(*(undefined8 *)(local_30 + 0x38),&stack0xffffffffffffffb8,
                                 &stack0xffffffffffffffb0), iVar1 == 0)) {
        *local_18 = (long)&in_stack_ffffffffffffffb8->sunctx + *local_18;
        *local_20 = (long)(in_stack_ffffffffffffffb0 + *local_20);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeGetLinWorkSpace(void* arkode_mem, long int* lenrw, long int* leniw)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return 0 for incompatible steppers */
  if (!ark_mem->step_supports_implicit)
  {
    *lenrw = *leniw = 0;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrw = 3;
  *leniw = 30;

  /* add NVector sizes */
  if (arkls_mem->x->ops->nvspace)
  {
    N_VSpace(arkls_mem->x, &lrw1, &liw1);
    *lenrw += 2 * lrw1;
    *leniw += 2 * liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (arkls_mem->savedJ)
  {
    if (arkls_mem->savedJ->ops->space)
    {
      retval = SUNMatSpace(arkls_mem->savedJ, &lrw, &liw);
      if (retval == 0)
      {
        *lenrw += lrw;
        *leniw += liw;
      }
    }
  }

  /* add LS sizes */
  if (arkls_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(arkls_mem->LS, &lrw, &liw);
    if (retval == SUN_SUCCESS)
    {
      *lenrw += lrw;
      *leniw += liw;
    }
  }

  return (ARKLS_SUCCESS);
}